

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_move.c
# Opt level: O0

void drowning_tick(CHAR_DATA *ch,AFFECT_DATA *af)

{
  bool bVar1;
  long in_RSI;
  CHAR_DATA *in_RDI;
  undefined1 in_stack_00001342;
  undefined1 in_stack_00001343;
  int in_stack_00001344;
  int in_stack_00001348;
  int in_stack_0000134c;
  CHAR_DATA *in_stack_00001350;
  CHAR_DATA *in_stack_00001358;
  int in_stack_00001378;
  int in_stack_00001380;
  char *in_stack_00001388;
  CHAR_DATA *in_stack_000037a8;
  CHAR_DATA *in_stack_000037b0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  CHAR_DATA *in_stack_ffffffffffffffe0;
  
  bVar1 = is_affected_room(in_RDI->in_room,(int)gsn_airy_water);
  if (((bVar1) || (in_RDI->in_room->sector_type != 8)) &&
     (bVar1 = is_affected(in_RDI,(int)gsn_drowning), bVar1)) {
    affect_strip(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  }
  else {
    bVar1 = is_immortal((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    if (!bVar1) {
      switch(*(undefined2 *)(in_RSI + 0x20)) {
      case 0:
        act((char *)in_stack_ffffffffffffffe0,
            (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
            (void *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
            (void *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),0);
        raw_kill(in_stack_000037b0,in_stack_000037a8);
        break;
      case 1:
      case 2:
        act((char *)in_stack_ffffffffffffffe0,
            (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
            (void *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
            (void *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),0);
        damage_new(in_stack_00001358,in_stack_00001350,in_stack_0000134c,in_stack_00001348,
                   in_stack_00001344,(bool)in_stack_00001343,(bool)in_stack_00001342,
                   in_stack_00001378,in_stack_00001380,in_stack_00001388);
        break;
      case 3:
        act((char *)in_stack_ffffffffffffffe0,
            (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
            (void *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
            (void *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),0);
        damage_new(in_stack_00001358,in_stack_00001350,in_stack_0000134c,in_stack_00001348,
                   in_stack_00001344,(bool)in_stack_00001343,(bool)in_stack_00001342,
                   in_stack_00001378,in_stack_00001380,in_stack_00001388);
        break;
      case 4:
        act((char *)in_stack_ffffffffffffffe0,
            (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
            (void *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
            (void *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),0);
        act((char *)in_stack_ffffffffffffffe0,
            (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
            (void *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
            (void *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),0);
      }
    }
  }
  return;
}

Assistant:

void drowning_tick(CHAR_DATA *ch, AFFECT_DATA *af)
{
	if ((is_affected_room(ch->in_room, gsn_airy_water) || ch->in_room->sector_type != SECT_UNDERWATER)
		&& is_affected(ch, gsn_drowning))
	{
		affect_strip(ch, gsn_drowning);
		return;
	}

	if (is_immortal(ch))
		return;

	switch (af->duration)
	{
		case 0:
			act("You drift into unconsciousness, and a sea of blackness swiftly overtakes you.", ch, 0, 0, TO_CHAR);
			raw_kill(ch, ch);
			break;
		case 1:
		case 2:
			act("Gasping involuntarily, you take huge amounts of water into your lungs!", ch, 0, 0, TO_CHAR);
			damage_new(ch, ch, (int)((ch->max_hit / 100) * 75), gsn_drowning, DAM_DROWNING, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "drowning");
			break;
		case 3:
			act("Your heart leaps in your chest, protesting the lack of oxygen!", ch, 0, 0, TO_CHAR);
			damage_new(ch, ch, (int)((ch->max_hit / 100) * 25), gsn_drowning, DAM_DROWNING, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "asphyxiation");
			break;
		case 4:
			act("Your face grows a deeper shade of red as you struggle to hold your breath!", ch, 0, 0, TO_CHAR);
			act("$n's face grows a deeper shade of red as $e struggles to hold $s breath!", ch, 0, 0, TO_ROOM);
			break;
	}
}